

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

void __thiscall
wallet::LegacyScriptPubKeyMan::UpdateTimeFirstKey(LegacyScriptPubKeyMan *this,int64_t nCreateTime)

{
  long lVar1;
  long lVar2;
  long args_1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 1;
  if (1 < nCreateTime) {
    args_1 = this->nTimeFirstKey;
    lVar2 = nCreateTime;
    if (args_1 != 0x7fffffffffffffff && args_1 <= nCreateTime) goto LAB_004cd715;
  }
  this->nTimeFirstKey = lVar2;
  args_1 = lVar2;
LAB_004cd715:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    boost::signals2::
    signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
    ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyFirstKeyTimeChanged,
                 (ScriptPubKeyMan *)this,args_1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::UpdateTimeFirstKey(int64_t nCreateTime)
{
    AssertLockHeld(cs_KeyStore);
    if (nCreateTime <= 1) {
        // Cannot determine birthday information, so set the wallet birthday to
        // the beginning of time.
        nTimeFirstKey = 1;
    } else if (nTimeFirstKey == UNKNOWN_TIME || nCreateTime < nTimeFirstKey) {
        nTimeFirstKey = nCreateTime;
    }

    NotifyFirstKeyTimeChanged(this, nTimeFirstKey);
}